

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h
# Opt level: O1

int __thiscall
TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>::ClassId
          (TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string local_a0;
  double local_80;
  TPZQuadSphere<pzgeom::TPZGeoQuad> local_78;
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"TPZGeoElRefLess","");
  uVar1 = Hash(&local_a0);
  iVar2 = TPZGeoEl::ClassId(&this->super_TPZGeoEl);
  local_78.super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[2]._0_4_
       = 0xffffffff;
  local_78.super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[2]._4_4_
       = 0xffffffff;
  local_78.super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[3]._0_4_
       = 0xffffffff;
  local_78.super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[3]._4_4_
       = 0xffffffff;
  local_78.super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[0]._0_4_
       = 0xffffffff;
  local_78.super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[0]._4_4_
       = 0xffffffff;
  local_78.super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[1]._0_4_
       = 0xffffffff;
  local_78.super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.fNodeIndexes[1]._4_4_
       = 0xffffffff;
  local_78.super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.super_TPZQuadrilateral
  .super_TPZSavable._vptr_TPZSavable = (TPZSavable)&PTR__TPZQuadSphere_018ce958;
  local_78.fR = 0.0;
  local_80 = 0.0;
  TPZVec<double>::TPZVec(&local_78.fxc,3,&local_80);
  iVar3 = pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>::ClassId(&local_78);
  local_78.super_TPZGeoQuad.super_TPZNodeRep<4,_pztopology::TPZQuadrilateral>.super_TPZQuadrilateral
  .super_TPZSavable._vptr_TPZSavable = (TPZSavable)&PTR__TPZQuadSphere_018ce958;
  local_78.fxc._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  if (local_78.fxc.fStore != (double *)0x0) {
    operator_delete__(local_78.fxc.fStore);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZGeoElRefLess<TGeo>::ClassId() const{
    return Hash("TPZGeoElRefLess") ^ TPZGeoEl::ClassId() << 1 ^ TGeo().ClassId() << 2;
}